

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmLineF<(moira::Instr)149,(moira::Mode)3,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  Int i;
  long lVar3;
  char cVar4;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar4 = '.';
    lVar3 = 1;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = ".short "[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    i.raw._2_2_ = 0;
    i.raw._0_2_ = op;
    StrWriter::operator<<(str,i);
    return;
  }
  cVar4 = 'd';
  lVar3 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "dc.w "[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,(UInt16)op);
  cVar4 = ';';
  lVar3 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = "dc.w    $%04x; opcode 1111"[lVar3 + 0xd];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  return;
}

Assistant:

void
Moira::dasmLineF(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; opcode 1111";
    }
}